

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddAbs.c
# Opt level: O3

DdNode * cuddAddOrAbstractRecur(DdManager *manager,DdNode *f,DdNode *cube)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *data;
  DdNode *pDVar4;
  ulong uVar5;
  
  pDVar3 = manager->one;
  if (pDVar3 == cube || (ulong)f->index == 0x7fffffff) {
    return f;
  }
  while (((ulong)cube->index != 0x7fffffff && (manager->perm[cube->index] < manager->perm[f->index])
         )) {
    cube = (cube->type).kids.T;
    if (pDVar3 == cube) {
      return f;
    }
  }
  pDVar2 = cuddCacheLookup2(manager,Cudd_addOrAbstract,f,cube);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  pDVar2 = (f->type).kids.T;
  pDVar4 = (f->type).kids.E;
  if (f->index == cube->index) {
    pDVar2 = cuddAddOrAbstractRecur(manager,pDVar2,(cube->type).kids.T);
    if (pDVar2 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    uVar5 = (ulong)pDVar2 & 0xfffffffffffffffe;
    *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
    data = pDVar2;
    if (pDVar2 == pDVar3) {
LAB_0077048a:
      cuddCacheInsert2(manager,Cudd_addOrAbstract,f,cube,data);
      *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + -1;
      return data;
    }
    pDVar3 = cuddAddOrAbstractRecur(manager,pDVar4,(cube->type).kids.T);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      data = cuddAddApplyRecur(manager,Cudd_addOr,pDVar2,pDVar3);
      if (data != (DdNode *)0x0) {
        uVar5 = (ulong)data & 0xfffffffffffffffe;
        *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
        Cudd_RecursiveDeref(manager,pDVar2);
        Cudd_RecursiveDeref(manager,pDVar3);
        goto LAB_0077048a;
      }
      Cudd_RecursiveDeref(manager,pDVar2);
      pDVar2 = pDVar3;
    }
  }
  else {
    pDVar2 = cuddAddOrAbstractRecur(manager,pDVar2,cube);
    if (pDVar2 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar3 = cuddAddOrAbstractRecur(manager,pDVar4,cube);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar4 = pDVar2;
      if ((pDVar2 == pDVar3) ||
         (pDVar4 = cuddUniqueInter(manager,f->index,pDVar2,pDVar3), pDVar4 != (DdNode *)0x0)) {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        cuddCacheInsert2(manager,Cudd_addOrAbstract,f,cube,pDVar4);
        return pDVar4;
      }
      Cudd_RecursiveDeref(manager,pDVar2);
      pDVar2 = pDVar3;
    }
  }
  Cudd_RecursiveDeref(manager,pDVar2);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddAddOrAbstractRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * cube)
{
    DdNode      *T, *E, *res, *res1, *res2, *one;

    statLine(manager);
    one = DD_ONE(manager);

    /* Cube is guaranteed to be a cube at this point. */
    if (cuddIsConstant(f) || cube == one) {  
        return(f);
    }

    /* Abstract a variable that does not appear in f. */
    if (cuddI(manager,f->index) > cuddI(manager,cube->index)) {
        res = cuddAddOrAbstractRecur(manager, f, cuddT(cube));
        return(res);
    }

    if ((res = cuddCacheLookup2(manager, Cudd_addOrAbstract, f, cube)) != NULL) {
        return(res);
    }

    T = cuddT(f);
    E = cuddE(f);

    /* If the two indices are the same, so are their levels. */
    if (f->index == cube->index) {
        res1 = cuddAddOrAbstractRecur(manager, T, cuddT(cube));
        if (res1 == NULL) return(NULL);
        cuddRef(res1);
        if (res1 != one) {
            res2 = cuddAddOrAbstractRecur(manager, E, cuddT(cube));
            if (res2 == NULL) {
                Cudd_RecursiveDeref(manager,res1);
                return(NULL);
            }
            cuddRef(res2);
            res = cuddAddApplyRecur(manager, Cudd_addOr, res1, res2);
            if (res == NULL) {
                Cudd_RecursiveDeref(manager,res1);
                Cudd_RecursiveDeref(manager,res2);
                return(NULL);
            }
            cuddRef(res);
            Cudd_RecursiveDeref(manager,res1);
            Cudd_RecursiveDeref(manager,res2);
        } else {
            res = res1;
        }
        cuddCacheInsert2(manager, Cudd_addOrAbstract, f, cube, res);
        cuddDeref(res);
        return(res);
    } else { /* if (cuddI(manager,f->index) < cuddI(manager,cube->index)) */
        res1 = cuddAddOrAbstractRecur(manager, T, cube);
        if (res1 == NULL) return(NULL);
        cuddRef(res1);
        res2 = cuddAddOrAbstractRecur(manager, E, cube);
        if (res2 == NULL) {
            Cudd_RecursiveDeref(manager,res1);
            return(NULL);
        }
        cuddRef(res2);
        res = (res1 == res2) ? res1 :
            cuddUniqueInter(manager, (int) f->index, res1, res2);
        if (res == NULL) {
            Cudd_RecursiveDeref(manager,res1);
            Cudd_RecursiveDeref(manager,res2);
            return(NULL);
        }
        cuddDeref(res1);
        cuddDeref(res2);
        cuddCacheInsert2(manager, Cudd_addOrAbstract, f, cube, res);
        return(res);
    }

}